

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

Image * operator^(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Image *image;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  int local_80;
  int local_7c;
  int j;
  int i;
  Image result;
  undefined1 local_50 [8];
  Image img2;
  Image img1;
  Image *image2_local;
  Image *image1_local;
  
  Image::binarize((Image *)&img2.matrix,image1);
  Image::binarize((Image *)local_50,image2);
  Image::clone((Image *)&j,(__fn *)&img2.matrix,__child_stack,in_ECX,in_R8);
  local_7c = 0;
  while( true ) {
    iVar2 = Image::getRow((Image *)&img2.matrix);
    if (iVar2 <= local_7c) break;
    local_80 = 0;
    while( true ) {
      iVar2 = Image::getCol((Image *)&img2.matrix);
      if (iVar2 <= local_80) break;
      piVar6 = Image::operator[]((Image *)&img2.matrix,local_7c);
      iVar2 = piVar6[local_80];
      iVar3 = Image::getMaxGray((Image *)&img2.matrix);
      piVar6 = Image::operator[]((Image *)local_50,local_7c);
      iVar1 = piVar6[local_80];
      iVar4 = Image::getMaxGray((Image *)local_50);
      iVar5 = 0;
      if ((iVar2 == iVar3) != (iVar1 == iVar4)) {
        iVar5 = 0xff;
      }
      piVar6 = Image::operator[]((Image *)&j,local_7c);
      piVar6[local_80] = iVar5;
      local_80 = local_80 + 1;
    }
    local_7c = local_7c + 1;
  }
  image = Image::normalize((Image *)&j);
  Image::Image(__return_storage_ptr__,image);
  Image::~Image((Image *)&j);
  Image::~Image((Image *)local_50);
  Image::~Image((Image *)&img2.matrix);
  return __return_storage_ptr__;
}

Assistant:

Image operator^(Image &image1, Image &image2)
{
    Image img1 = image1.binarize(), img2 = image2.binarize();

    Image result = img1.clone();

    for (int i = 0; i < img1.getRow(); ++i) {
        for (int j = 0; j < img1.getCol(); ++j) {
            result[i][j] =  img1[i][j] == img1.getMaxGray() ^ img2[i][j] == img2.getMaxGray() ? 255 : 0;
        }
    }

    return result.normalize();
}